

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.cc
# Opt level: O3

string * QPDFExc::createWhat(string *__return_storage_ptr__,string *filename,string *object,
                            qpdf_offset_t offset,string *message)

{
  bool bVar1;
  uint uVar2;
  long *plVar3;
  ulong uVar4;
  long *plVar5;
  size_type sVar6;
  unsigned_long_long __uval;
  uint __len;
  string __str;
  long *local_78 [2];
  long local_68 [2];
  string *local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (filename->_M_string_length != 0) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(filename->_M_dataplus)._M_p);
  }
  sVar6 = object->_M_string_length;
  if (offset < 0 && sVar6 == 0) goto LAB_0016755f;
  if (filename->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    sVar6 = object->_M_string_length;
  }
  if (sVar6 == 0) {
    if (-1 < offset) goto LAB_001673fc;
  }
  else {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(object->_M_dataplus)._M_p);
    if (-1 < offset) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_001673fc:
      __len = 1;
      if (9 < (ulong)offset) {
        uVar4 = offset;
        uVar2 = 4;
        do {
          __len = uVar2;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_0016745c;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_0016745c;
          }
          if (uVar4 < 10000) goto LAB_0016745c;
          bVar1 = 99999 < uVar4;
          uVar4 = uVar4 / 10000;
          uVar2 = __len + 4;
        } while (bVar1);
        __len = __len + 1;
      }
LAB_0016745c:
      local_78[0] = local_68;
      local_58 = message;
      std::__cxx11::string::_M_construct((ulong)local_78,(char)__len - (char)(offset >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                ((char *)((long)local_78[0] - (offset >> 0x3f)),__len,offset);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x2801f3);
      message = local_58;
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_40 = *plVar5;
        lStack_38 = plVar3[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar5;
        local_50 = (long *)*plVar3;
      }
      local_48 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
    }
  }
  if (filename->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
LAB_0016755f:
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(message->_M_dataplus)._M_p)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFExc::createWhat(
    std::string const& filename,
    std::string const& object,
    qpdf_offset_t offset,
    std::string const& message)
{
    std::string result;
    if (!filename.empty()) {
        result += filename;
    }
    if (!(object.empty() && offset < 0)) {
        if (!filename.empty()) {
            result += " (";
        }
        if (!object.empty()) {
            result += object;
            if (offset >= 0) {
                result += ", ";
            }
        }
        if (offset >= 0) {
            result += "offset " + std::to_string(offset);
        }
        if (!filename.empty()) {
            result += ")";
        }
    }
    if (!result.empty()) {
        result += ": ";
    }
    result += message;
    return result;
}